

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mount_point.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall cppcms::mount_point::match_abi_cxx11_(mount_point *this,char *h,char *s,char *p)

{
  byte bVar1;
  bool bVar2;
  char *in_RCX;
  match_results<const_char_*> *in_RSI;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  char *in_R8;
  cmatch m_1;
  cmatch m;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *res;
  sub_match<const_char_*> *in_stack_fffffffffffffec8;
  undefined5 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed5;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *r;
  string local_e8 [12];
  int in_stack_ffffffffffffff24;
  regex *in_stack_ffffffffffffff28;
  cmatch *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  string local_88 [72];
  undefined4 local_40;
  byte local_29;
  char *local_28;
  char *local_20;
  
  local_29 = 0;
  r = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  std::pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x450d26);
  r->first = false;
  bVar1 = booster::regex::empty();
  if (((bVar1 & 1) != 0) ||
     (bVar2 = booster::regex_match<booster::regex>
                        ((char *)in_RSI,(regex *)r,(int)((ulong)in_RDI >> 0x20)), bVar2)) {
    if (*(int *)((long)&(in_RSI->offsets_).
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) == 0) {
      bVar1 = booster::regex::empty();
      if (((bVar1 & 1) != 0) ||
         (bVar2 = booster::regex_match<booster::regex>
                            ((char *)in_RSI,(regex *)r,(int)((ulong)in_RDI >> 0x20)), bVar2)) {
        bVar1 = booster::regex::empty();
        if ((bVar1 & 1) == 0) {
          if (*(int *)&(in_RSI->offsets_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish == 0) {
            bVar2 = booster::regex_match<booster::regex>
                              ((char *)in_RSI,(regex *)r,(int)((ulong)in_RDI >> 0x20));
            if (bVar2) {
              std::__cxx11::string::operator=((string *)&r->second,local_28);
              r->first = true;
              local_29 = 1;
              local_40 = 1;
            }
            else {
              local_29 = 1;
              local_40 = 1;
            }
          }
          else {
            booster::match_results<const_char_*>::match_results
                      ((match_results<const_char_*> *)
                       CONCAT17(in_stack_fffffffffffffed7,
                                CONCAT16(in_stack_fffffffffffffed6,
                                         CONCAT15(in_stack_fffffffffffffed5,
                                                  in_stack_fffffffffffffed0))));
            bVar2 = booster::regex_match<booster::regex>
                              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
            if (bVar2) {
              booster::match_results<const_char_*>::operator[](in_RSI,(int)((ulong)r >> 0x20));
              booster::sub_match::operator_cast_to_string(in_stack_fffffffffffffec8);
              std::__cxx11::string::operator=((string *)&r->second,local_88);
              std::__cxx11::string::~string(local_88);
              r->first = true;
            }
            local_29 = 1;
            local_40 = 1;
            booster::match_results<const_char_*>::~match_results
                      ((match_results<const_char_*> *)0x450fe1);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&r->second,local_28);
          r->first = true;
          local_29 = 1;
          local_40 = 1;
        }
      }
      else {
        local_29 = 1;
        local_40 = 1;
      }
    }
    else {
      bVar1 = booster::regex::empty();
      if (((bVar1 & 1) != 0) ||
         (bVar2 = booster::regex_match<booster::regex>
                            ((char *)in_RSI,(regex *)r,(int)((ulong)in_RDI >> 0x20)), bVar2)) {
        bVar1 = booster::regex::empty();
        if ((bVar1 & 1) == 0) {
          if (*(int *)&(in_RSI->offsets_).
                       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish == 0) {
            bVar2 = booster::regex_match<booster::regex>
                              ((char *)in_RSI,(regex *)r,(int)((ulong)in_RDI >> 0x20));
            if (bVar2) {
              std::__cxx11::string::operator=((string *)&r->second,local_20);
              r->first = true;
              local_29 = 1;
              local_40 = 1;
            }
            else {
              local_29 = 1;
              local_40 = 1;
            }
          }
          else {
            booster::match_results<const_char_*>::match_results
                      ((match_results<const_char_*> *)
                       CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffed6,
                                               CONCAT15(in_stack_fffffffffffffed5,
                                                        in_stack_fffffffffffffed0))));
            bVar2 = booster::regex_match<booster::regex>
                              (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               in_stack_ffffffffffffff28,in_stack_ffffffffffffff24);
            if (bVar2) {
              booster::match_results<const_char_*>::operator[](in_RSI,(int)((ulong)r >> 0x20));
              booster::sub_match::operator_cast_to_string(in_stack_fffffffffffffec8);
              std::__cxx11::string::operator=((string *)&r->second,local_e8);
              std::__cxx11::string::~string(local_e8);
              r->first = true;
            }
            local_29 = 1;
            local_40 = 1;
            booster::match_results<const_char_*>::~match_results
                      ((match_results<const_char_*> *)0x4511fd);
          }
        }
        else {
          std::__cxx11::string::operator=((string *)&r->second,local_20);
          r->first = true;
          local_29 = 1;
          local_40 = 1;
        }
      }
      else {
        local_29 = 1;
        local_40 = 1;
      }
    }
  }
  else {
    local_29 = 1;
    local_40 = 1;
  }
  if ((local_29 & 1) == 0) {
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x451211);
  }
  return in_RDI;
}

Assistant:

std::pair<bool,std::string> mount_point::match(char const *h,char const *s,char const *p) const
{
	std::pair<bool,std::string> res;
	res.first = false;

	if(!host_.empty() && !booster::regex_match(h,host_))
		return res;

	if(selection_ == match_path_info) {
		if(!script_name_.empty() && !booster::regex_match(s,script_name_))
			return res;
		if(path_info_.empty()) {
			res.second = p;
			res.first = true;
			return res;
		}
		
		if(group_ == 0) {
			if(!booster::regex_match(p,path_info_))
				return res;
			res.second=p;
			res.first=true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(p,m,path_info_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
	else {
		if(!path_info_.empty() && !booster::regex_match(p,path_info_))
			return res;
		if(script_name_.empty()) {
			res.second=s;
			res.first = true;
			return res;
		}
		if(group_ == 0) {
			if(!booster::regex_match(s,script_name_))
				return res;
			res.second=s;
			res.first = true;
			return res;
		}
		else {
			booster::cmatch m;
			if(!booster::regex_match(s,m,script_name_))
				return res;
			res.second=m[group_];
			res.first = true;
			return res;
		}
	}
}